

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vcgen_contour.cpp
# Opt level: O1

void __thiscall agg::vcgen_contour::rewind(vcgen_contour *this,FILE *__stream)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  if (this->m_status == initial) {
    vertex_sequence<agg::vertex_dist,_6U>::close(&this->m_src_vertices,1);
    if ((this->m_auto_detect == true) && ((this->m_orientation & 0x30) == 0)) {
      dVar1 = calc_polygon_area<agg::vertex_sequence<agg::vertex_dist,6u>>(&this->m_src_vertices);
      this->m_orientation = (uint)(dVar1 <= 0.0) * 0x10 + 0x10;
    }
    if ((this->m_orientation & 0x30) != 0) {
      dVar1 = this->m_width;
      if ((this->m_orientation & 0x10) == 0) {
        dVar1 = -dVar1;
      }
      dVar1 = dVar1 * 0.5;
      dVar2 = -dVar1;
      (this->m_stroker).m_width = dVar1;
      dVar3 = dVar2;
      if (dVar2 <= dVar1) {
        dVar3 = dVar1;
      }
      (this->m_stroker).m_width_abs = dVar3;
      (this->m_stroker).m_width_sign = (uint)(dVar2 <= dVar1) * 2 + -1;
      (this->m_stroker).m_width_eps = dVar1 * 0.0009765625;
    }
  }
  this->m_status = ready;
  this->m_src_vertex = 0;
  return;
}

Assistant:

void vcgen_contour::rewind(unsigned)
    {
        if(m_status == initial)
        {
            m_src_vertices.close(true);
            if(m_auto_detect)
            {
                if(!is_oriented(m_orientation))
                {
                    m_orientation = (calc_polygon_area(m_src_vertices) > 0.0) ? 
                                    path_flags_ccw : 
                                    path_flags_cw;
                }
            }
            if(is_oriented(m_orientation))
            {
                m_stroker.width(is_ccw(m_orientation) ? m_width : -m_width);
            }
        }
        m_status = ready;
        m_src_vertex = 0;
    }